

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::detail::error_fetch_and_normalize::error_fetch_and_normalize
          (error_fetch_and_normalize *this,char *called)

{
  PyTypeObject *pPVar1;
  bool bVar2;
  PyTypeObject *pPVar3;
  string msg;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (this->m_type).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_value).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_trace).super_handle.m_ptr = (PyObject *)0x0;
  (this->m_lazy_error_string)._M_dataplus._M_p = (pointer)&(this->m_lazy_error_string).field_2;
  (this->m_lazy_error_string)._M_string_length = 0;
  (this->m_lazy_error_string).field_2._M_local_buf[0] = '\0';
  this->m_lazy_error_string_completed = false;
  this->m_restore_called = false;
  PyErr_Fetch(this,&this->m_value,&this->m_trace);
  pPVar1 = (PyTypeObject *)(this->m_type).super_handle.m_ptr;
  if (pPVar1 == (PyTypeObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,called,&local_91);
    std::operator+(&local_90,"Internal error: ",&local_50);
    std::operator+(&local_70,&local_90," called while Python error indicator not set.");
    pybind11_fail(&local_70);
  }
  pPVar3 = *(PyTypeObject **)((long)&pPVar1->ob_base + 8);
  if (*(PyTypeObject **)((long)&pPVar1->ob_base + 8) == (PyTypeObject *)&PyType_Type) {
    pPVar3 = pPVar1;
  }
  if (pPVar3->tp_name == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,called,&local_91);
    std::operator+(&local_90,"Internal error: ",&local_50);
    std::operator+(&local_70,&local_90,
                   " failed to obtain the name of the original active exception type.");
    pybind11_fail(&local_70);
  }
  std::__cxx11::string::assign((char *)&this->m_lazy_error_string);
  PyErr_NormalizeException(this,&this->m_value,&this->m_trace);
  pPVar1 = (PyTypeObject *)(this->m_type).super_handle.m_ptr;
  if (pPVar1 == (PyTypeObject *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,called,&local_91);
    std::operator+(&local_90,"Internal error: ",&local_50);
    std::operator+(&local_70,&local_90," failed to normalize the active exception.");
    pybind11_fail(&local_70);
  }
  pPVar3 = *(PyTypeObject **)((long)&pPVar1->ob_base + 8);
  if (*(PyTypeObject **)((long)&pPVar1->ob_base + 8) == (PyTypeObject *)&PyType_Type) {
    pPVar3 = pPVar1;
  }
  bVar2 = std::operator!=(pPVar3->tp_name,&this->m_lazy_error_string);
  if (!bVar2) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,called,(allocator<char> *)&local_50);
  std::operator+(&local_70,&local_90,
                 ": MISMATCH of original and normalized active exception types: ");
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::append((string *)&local_70);
  std::__cxx11::string::append((char *)&local_70);
  std::__cxx11::string::append((char *)&local_70);
  format_value_and_trace_abi_cxx11_(&local_50,this);
  std::operator+(&local_90,": ",&local_50);
  std::__cxx11::string::append((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  pybind11_fail(&local_70);
}

Assistant:

explicit error_fetch_and_normalize(const char *called) {
        PyErr_Fetch(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (!m_type) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " called while "
                            "Python error indicator not set.");
        }
        const char *exc_type_name_orig = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_orig == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the original active exception type.");
        }
        m_lazy_error_string = exc_type_name_orig;
        // PyErr_NormalizeException() may change the exception type if there are cascading
        // failures. This can potentially be extremely confusing.
        PyErr_NormalizeException(&m_type.ptr(), &m_value.ptr(), &m_trace.ptr());
        if (m_type.ptr() == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to normalize the "
                            "active exception.");
        }
        const char *exc_type_name_norm = detail::obj_class_name(m_type.ptr());
        if (exc_type_name_orig == nullptr) {
            pybind11_fail("Internal error: " + std::string(called)
                          + " failed to obtain the name "
                            "of the normalized active exception type.");
        }
#if defined(PYPY_VERSION)
        // This behavior runs the risk of masking errors in the error handling, but avoids a
        // conflict with PyPy, which relies on the normalization here to change OSError to
        // FileNotFoundError (https://github.com/pybind/pybind11/issues/4075).
        m_lazy_error_string = exc_type_name_norm;
#else
        if (exc_type_name_norm != m_lazy_error_string) {
            std::string msg = std::string(called)
                              + ": MISMATCH of original and normalized "
                                "active exception types: ";
            msg += "ORIGINAL ";
            msg += m_lazy_error_string;
            msg += " REPLACED BY ";
            msg += exc_type_name_norm;
            msg += ": " + format_value_and_trace();
            pybind11_fail(msg);
        }
#endif
    }